

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affinespace.h
# Opt level: O0

void __thiscall
embree::QuaternionDecomposition::QuaternionDecomposition(QuaternionDecomposition *this)

{
  QuaternionDecomposition *this_local;
  
  this->scale_x = 1.0;
  this->scale_y = 1.0;
  this->scale_z = 1.0;
  this->skew_xy = 0.0;
  this->skew_xz = 0.0;
  this->skew_yz = 0.0;
  this->shift_x = 0.0;
  this->shift_y = 0.0;
  this->shift_z = 0.0;
  this->quaternion_r = 1.0;
  this->quaternion_i = 0.0;
  this->quaternion_j = 0.0;
  this->quaternion_k = 0.0;
  this->translation_x = 0.0;
  this->translation_y = 0.0;
  this->translation_z = 0.0;
  return;
}

Assistant:

struct __aligned(16) QuaternionDecomposition
  {
    float scale_x = 1.f;
    float scale_y = 1.f;
    float scale_z = 1.f;
    float skew_xy = 0.f;
    float skew_xz = 0.f;
    float skew_yz = 0.f;
    float shift_x = 0.f;
    float shift_y = 0.f;
    float shift_z = 0.f;
    float quaternion_r = 1.f;
    float quaternion_i = 0.f;
    float quaternion_j = 0.f;
    float quaternion_k = 0.f;
    float translation_x = 0.f;
    float translation_y = 0.f;
    float translation_z = 0.f;
  }